

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcdata_varnode.cc
# Opt level: O3

void __thiscall Funcdata::setHighLevel(Funcdata *this)

{
  _Rb_tree_node_base *p_Var1;
  
  if ((this->flags & 1) == 0) {
    this->flags = this->flags | 1;
    this->high_level_index = (this->vbank).create_index;
    for (p_Var1 = (this->vbank).loc_tree._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var1 != &(this->vbank).loc_tree._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      assignHigh(this,*(Varnode **)(p_Var1 + 1));
    }
  }
  return;
}

Assistant:

void Funcdata::setHighLevel(void)

{
  if ((flags & highlevel_on)!=0) return;
  flags |= highlevel_on;
  high_level_index = vbank.getCreateIndex();
  VarnodeLocSet::const_iterator iter;

  for(iter=vbank.beginLoc();iter!=vbank.endLoc();++iter)
    assignHigh(*iter);
}